

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.h
# Opt level: O3

ssize_t __thiscall Deserializer::read(Deserializer *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 in_register_00000034;
  void *__buf_00;
  Log local_c0;
  Log local_b0;
  Log local_a0;
  Log local_90;
  Log local_80;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_70;
  uint local_68;
  undefined1 local_60 [16];
  Log local_50;
  Log local_40;
  Log local_30;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  sVar2 = (ulong)__buf & 0xffffffff;
  if (read(void*,int)::dump == '\0') {
    read((int)this,__buf_00,(size_t)__buf);
  }
  iVar5 = (int)__buf;
  if (read::dump == true) {
    printf("Reading %d bytes for %s\n",sVar2,this->mKey);
  }
  if (iVar5 == 0) {
    sVar2 = 0;
  }
  else if (this->mData == (char *)0x0) {
    if ((FILE *)this->mFile == (FILE *)0x0) {
      __assert_fail("mFile",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Serializer.h"
                    ,0xb9,"int Deserializer::read(void *, int)");
    }
    sVar2 = fread(__buf_00,1,(long)iVar5,(FILE *)this->mFile);
  }
  else {
    iVar3 = this->mLength;
    iVar1 = this->mPos;
    iVar4 = iVar1 + iVar5;
    if (iVar3 < iVar4) {
      local_70.mValue = 1;
      Log::Log(&local_50,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_70);
      Log::write(&local_b0,(int)&local_50,"About to die",0xffffffff);
      Log::addStringStream<int>(&local_a0,(int)&local_b0);
      Log::addStringStream<int>(&local_90,(int)&local_a0);
      Log::addStringStream<int>(&local_80,(int)&local_90);
      local_70.mValue._0_1_ = 10;
      Log::write(&local_c0,(int)&local_80,&local_70,1);
      Rct::backtrace((String *)&local_70,-1);
      Log::write(&local_30,(int)&local_c0,(void *)local_70,(ulong)local_68);
      if (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      Log::Log(&local_40,&local_c0);
      if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((undefined1 *)local_70.mValue != local_60) {
        operator_delete((void *)local_70);
      }
      if (local_c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_b0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar3 = this->mLength;
      iVar1 = this->mPos;
      iVar4 = iVar1 + iVar5;
    }
    if (iVar3 < iVar4) {
      __assert_fail("mPos + len <= mLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Serializer.h"
                    ,0xb4,"int Deserializer::read(void *, int)");
    }
    memcpy(__buf_00,this->mData + iVar1,(long)iVar5);
    this->mPos = this->mPos + iVar5;
  }
  return sVar2 & 0xffffffff;
}

Assistant:

int read(void *target, int len)
    {
        static const bool dump = getenv("RCT_SERIALIZER_DUMP");
        if (dump) {
            printf("Reading %d bytes for %s\n", len, mKey);
        }
        if (len) {
            if (mData) {
                if (mPos + len > mLength) {
                    error() << "About to die" << mPos << len << mLength << '\n' << Rct::backtrace();

                }
                assert(mPos + len <= mLength);
                memcpy(target, mData + mPos, len);
                mPos += len;
                return len;
            } else {
                assert(mFile);
                return fread(target, sizeof(char), len, mFile);
            }
        }
        return 0;
    }